

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::clear_covers(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
               *this)

{
  Index row;
  ulong uVar1;
  reference rVar2;
  
  for (uVar1 = 0;
      uVar1 < (ulong)(this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)(this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      uVar1 = uVar1 + 1) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->row_cover,uVar1);
    *rVar2._M_p = *rVar2._M_p & ~rVar2._M_mask;
  }
  for (uVar1 = 0;
      uVar1 < (ulong)(this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)(this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      uVar1 = uVar1 + 1) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->col_cover,uVar1);
    *rVar2._M_p = *rVar2._M_p & ~rVar2._M_mask;
  }
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::clear_covers()
{
    for (Index row = 0; row < row_cover.size(); ++row) {
        row_cover[row] = false;
    }
    for (Index col = 0; col < col_cover.size(); ++col) {
        col_cover[col] = false;
    }
}